

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-4-module-types.cpp
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::parseModuleTypes
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes)

{
  undefined1 local_f0 [8];
  ParseModuleTypesCtx ctx;
  undefined1 local_48 [8];
  Result<wasm::Ok> _val;
  
  ParseModuleTypesCtx::ParseModuleTypesCtx
            ((ParseModuleTypesCtx *)local_f0,input,decls->wasm,types,implicitTypes,
             &decls->implicitElemIndices,typeIndices);
  parseDefs<wasm::WATParser::ParseModuleTypesCtx>
            ((Result<wasm::Ok> *)local_48,(ParseModuleTypesCtx *)local_f0,&decls->funcDefs,
             func<wasm::WATParser::ParseModuleTypesCtx>);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)&ctx.index,(string *)local_48);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&ctx.index);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
    parseDefs<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::Ok> *)local_48,(ParseModuleTypesCtx *)local_f0,&decls->tableDefs,
               table<wasm::WATParser::ParseModuleTypesCtx>);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)&ctx.index,(string *)local_48);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&ctx.index);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
      parseDefs<wasm::WATParser::ParseModuleTypesCtx>
                ((Result<wasm::Ok> *)local_48,(ParseModuleTypesCtx *)local_f0,&decls->memoryDefs,
                 memory<wasm::WATParser::ParseModuleTypesCtx>);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)&ctx.index,(string *)local_48);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&ctx.index);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
        parseDefs<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Ok> *)local_48,(ParseModuleTypesCtx *)local_f0,&decls->globalDefs,
                   global<wasm::WATParser::ParseModuleTypesCtx>);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string((string *)&ctx.index,(string *)local_48);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&ctx.index
                    );
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
          parseDefs<wasm::WATParser::ParseModuleTypesCtx>
                    ((Result<wasm::Ok> *)local_48,(ParseModuleTypesCtx *)local_f0,&decls->elemDefs,
                     elem<wasm::WATParser::ParseModuleTypesCtx>);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string((string *)&ctx.index,(string *)local_48);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                       &ctx.index);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
            parseDefs<wasm::WATParser::ParseModuleTypesCtx>
                      ((Result<wasm::Ok> *)local_48,(ParseModuleTypesCtx *)local_f0,&decls->tagDefs,
                       tag<wasm::WATParser::ParseModuleTypesCtx>);
            if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
              goto LAB_00c391e9;
            }
            std::__cxx11::string::string((string *)&ctx.index,(string *)local_48);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                       &ctx.index);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&ctx.index);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
LAB_00c391e9:
  Lexer::~Lexer((Lexer *)&ctx);
  return __return_storage_ptr__;
}

Assistant:

Result<> parseModuleTypes(ParseDeclsCtx& decls,
                          Lexer& input,
                          IndexMap& typeIndices,
                          std::vector<HeapType>& types,
                          std::unordered_map<Index, HeapType>& implicitTypes) {
  ParseModuleTypesCtx ctx(input,
                          decls.wasm,
                          types,
                          implicitTypes,
                          decls.implicitElemIndices,
                          typeIndices);
  CHECK_ERR(parseDefs(ctx, decls.funcDefs, func));
  CHECK_ERR(parseDefs(ctx, decls.tableDefs, table));
  CHECK_ERR(parseDefs(ctx, decls.memoryDefs, memory));
  CHECK_ERR(parseDefs(ctx, decls.globalDefs, global));
  CHECK_ERR(parseDefs(ctx, decls.elemDefs, elem));
  CHECK_ERR(parseDefs(ctx, decls.tagDefs, tag));
  return Ok{};
}